

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

int hasB64Wrapper(string_view str)

{
  char cVar1;
  int iVar2;
  char *in_RSI;
  ulong in_RDI;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_10._M_len = in_RDI;
  local_10._M_str = in_RSI;
  if (*in_RSI == '\"') {
    if (in_RDI < 8) {
      return 0;
    }
    iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_10,2,3,"64[")
    ;
    if ((iVar2 == 0) && (local_10._M_str[local_10._M_len - 2] == ']')) {
      return 5;
    }
    if (local_10._M_len < 0xb) {
      return 0;
    }
    iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_10,5,3,"64[")
    ;
    if (iVar2 != 0) {
      return 0;
    }
    iVar2 = 8;
    cVar1 = local_10._M_str[local_10._M_len - 2];
  }
  else {
    if (in_RDI < 6) {
      return 0;
    }
    iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_10,1,3,"64[")
    ;
    if ((iVar2 == 0) && (local_10._M_str[local_10._M_len - 1] == ']')) {
      return 4;
    }
    if (local_10._M_len < 9) {
      return 0;
    }
    iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_10,4,3,"64[")
    ;
    if (iVar2 != 0) {
      return 0;
    }
    iVar2 = 7;
    cVar1 = local_10._M_str[local_10._M_len - 1];
  }
  if (cVar1 != ']') {
    return 0;
  }
  return iVar2;
}

Assistant:

static int hasB64Wrapper(std::string_view str)
{
    if (str.front() == '\"') {
        if (str.size() < 8) {
            return 0;
        }
        if ((str.compare(2, 3, "64[") == 0) && (str[str.size() - 2] == ']')) {
            return 5;
        }
        if (str.size() < 11) {
            return 0;
        }
        if ((str.compare(5, 3, "64[") == 0) && (str[str.size() - 2] == ']')) {
            return 8;
        }
    } else {
        if (str.size() < 6) {
            return 0;
        }
        if ((str.compare(1, 3, "64[") == 0) && (str.back() == ']')) {
            return 4;
        }
        if (str.size() < 9) {
            return 0;
        }
        if ((str.compare(4, 3, "64[") == 0) && (str.back() == ']')) {
            return 7;
        }
    }

    return 0;
}